

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectRestraint.cpp
# Opt level: O2

void __thiscall
OpenMD::ObjectRestraint::calcForce(ObjectRestraint *this,Vector3d *struc,RotMat3x3d *A)

{
  mapped_type *pmVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  RealType swingY;
  RealType swingX;
  RealType twistAngle;
  Vector3d tBody;
  Vector3d tLab;
  Vector3d tSwing;
  Vector3d tTwist;
  Quat4d quat;
  RotMat3x3d temp;
  double local_178;
  double local_170;
  double local_168;
  Vector<double,_3U> local_160;
  RectMatrix<double,_3U,_3U> local_148;
  Vector<double,_3U> local_100;
  Vector<double,_3U> local_e8;
  Vector<double,_3U> local_d0;
  Vector<double,_3U> local_b8;
  Vector<double,_3U> local_a0;
  Quaternion<double> local_88;
  SquareMatrix3<double> local_68;
  
  Vector<double,_3U>::Vector(&local_a0,&struc->super_Vector<double,_3U>);
  calcForce(this,(Vector3d *)&local_a0);
  if (3 < (this->super_Restraint).restType_) {
    local_148.data_[0][0] = 0.0;
    Vector<double,_3U>::Vector((Vector<double,_3U> *)&local_68,(double *)&local_148);
    Vector<double,_3U>::Vector(&local_160,(Vector<double,_3U> *)&local_68);
    SquareMatrix3<double>::transpose((SquareMatrix3<double> *)&local_148,&this->refA_);
    operator*(&local_68,A,(SquareMatrix3<double> *)&local_148);
    SquareMatrix3<double>::toQuaternion(&local_88,&local_68);
    Quaternion<double>::toTwistSwing(&local_88,&local_168,&local_170,&local_178);
    Vector<double,_3U>::Vector(&local_b8);
    Vector<double,_3U>::Vector(&local_d0);
    if (((this->super_Restraint).restType_ & 4) != 0) {
      dVar2 = local_168 - (this->super_Restraint).twist0_;
      dVar3 = (this->super_Restraint).kTwist_;
      dVar4 = dVar3 * 0.5 * dVar2 * dVar2;
      (this->super_Restraint).pot_ = (this->super_Restraint).pot_ + dVar4;
      operator*((Vector<double,_3U> *)&local_148,dVar3 * dVar2,(Vector<double,_3U> *)OpenMD::V3Z);
      Vector<double,_3U>::sub(&local_160,(Vector<double,_3U> *)&local_148);
      if ((this->super_Restraint).printRest_ == true) {
        local_148.data_[0][0] = (double)CONCAT44(local_148.data_[0][0]._4_4_,4);
        pmVar1 = std::
                 map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
                 ::operator[](&(this->super_Restraint).restInfo_,(key_type *)&local_148);
        pmVar1->first = local_168;
        pmVar1->second = dVar4;
      }
    }
    if (((this->super_Restraint).restType_ & 8) != 0) {
      dVar2 = local_170 - (this->super_Restraint).swingX0_;
      dVar3 = (this->super_Restraint).kSwingX_;
      dVar4 = dVar3 * 0.5 * dVar2 * dVar2;
      (this->super_Restraint).pot_ = (this->super_Restraint).pot_ + dVar4;
      operator*((Vector<double,_3U> *)&local_148,dVar3 * dVar2,(Vector<double,_3U> *)OpenMD::V3X);
      Vector<double,_3U>::sub(&local_160,(Vector<double,_3U> *)&local_148);
      if ((this->super_Restraint).printRest_ == true) {
        local_148.data_[0][0] = (double)CONCAT44(local_148.data_[0][0]._4_4_,8);
        pmVar1 = std::
                 map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
                 ::operator[](&(this->super_Restraint).restInfo_,(key_type *)&local_148);
        pmVar1->first = local_170;
        pmVar1->second = dVar4;
      }
    }
    if (((this->super_Restraint).restType_ & 0x10) != 0) {
      dVar3 = local_178 - (this->super_Restraint).swingY0_;
      dVar2 = (this->super_Restraint).kSwingX_ * 0.5 * dVar3 * dVar3;
      (this->super_Restraint).pot_ = (this->super_Restraint).pot_ + dVar2;
      operator*((Vector<double,_3U> *)&local_148,(this->super_Restraint).kSwingY_ * dVar3,
                (Vector<double,_3U> *)OpenMD::V3Y);
      Vector<double,_3U>::sub(&local_160,(Vector<double,_3U> *)&local_148);
      if ((this->super_Restraint).printRest_ == true) {
        local_148.data_[0][0] = (double)CONCAT44(local_148.data_[0][0]._4_4_,0x10);
        pmVar1 = std::
                 map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
                 ::operator[](&(this->super_Restraint).restInfo_,(key_type *)&local_148);
        pmVar1->first = local_178;
        pmVar1->second = dVar2;
      }
    }
    SquareMatrix3<double>::transpose((SquareMatrix3<double> *)&local_148,A);
    operator*(&local_100,&local_148,&local_160);
    Vector<double,_3U>::Vector(&local_e8,&local_100);
    operator*((Vector<double,_3U> *)&local_148,&local_e8,(this->super_Restraint).scaleFactor_);
    Vector3<double>::operator=(&this->torque_,(Vector<double,_3U> *)&local_148);
  }
  return;
}

Assistant:

void ObjectRestraint::calcForce(Vector3d struc, RotMat3x3d A) {
    calcForce(struc);

    // rtDisplacement is 1, rtAbsolute is 2, so anything higher than 3
    // that requires orientations:
    if (restType_ > 3) {
      Vector3d tBody(0.0);

      RotMat3x3d temp = A * refA_.transpose();
      Quat4d quat     = temp.toQuaternion();

      RealType twistAngle;
      RealType swingX, swingY;

      quat.toTwistSwing(twistAngle, swingX, swingY);

      RealType p;
      Vector3d tTwist, tSwing;

      if (restType_ & rtTwist) {
        RealType dTwist = twistAngle - twist0_;
        /// RealType dVdtwist = kTwist_ * sin(dTwist);
        /// p = kTwist_ * (1.0 - cos(dTwist) );
        RealType dVdtwist = kTwist_ * dTwist;
        p                 = 0.5 * kTwist_ * dTwist * dTwist;
        pot_ += p;
        tBody -= dVdtwist * V3Z;

        if (printRest_) restInfo_[rtTwist] = std::make_pair(twistAngle, p);
      }

      if (restType_ & rtSwingX) {
        RealType dSwingX = swingX - swingX0_;
        /// RealType dVdswingX = kSwingX_ * 0.5 * sin(2.0 * dSwingX);
        /// p = 0.25 * kSwingX_ * (1.0 - cos(2.0 * dSwingX));
        RealType dVdswingX = kSwingX_ * dSwingX;
        p                  = 0.5 * kSwingX_ * dSwingX * dSwingX;
        pot_ += p;
        tBody -= dVdswingX * V3X;
        if (printRest_) restInfo_[rtSwingX] = std::make_pair(swingX, p);
      }

      if (restType_ & rtSwingY) {
        RealType dSwingY = swingY - swingY0_;
        /// RealType dVdswingY = kSwingY_ * 0.5 * sin(2.0 * dSwingY);
        /// p = 0.25 * kSwingY_ * (1.0 - cos(2.0 * dSwingY));
        RealType dVdswingY = kSwingY_ * dSwingY;
        p                  = 0.5 * kSwingX_ * dSwingY * dSwingY;
        pot_ += p;
        tBody -= dVdswingY * V3Y;
        if (printRest_) restInfo_[rtSwingY] = std::make_pair(swingY, p);
      }

      Vector3d tLab = A.transpose() * tBody;
      torque_       = tLab * scaleFactor_;
    }
  }